

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPolicies.cxx
# Opt level: O0

PolicyStatus __thiscall cmPolicies::PolicyMap::Get(PolicyMap *this,PolicyID id)

{
  bool bVar1;
  undefined4 local_18;
  PolicyStatus status;
  PolicyID id_local;
  PolicyMap *this_local;
  
  local_18 = WARN;
  bVar1 = std::bitset<273UL>::operator[](&this->Status,(long)(int)(id * 3));
  if (bVar1) {
    local_18 = OLD;
  }
  else {
    bVar1 = std::bitset<273UL>::operator[](&this->Status,(long)(int)(id * 3 + 2));
    if (bVar1) {
      local_18 = NEW;
    }
  }
  return local_18;
}

Assistant:

cmPolicies::PolicyStatus cmPolicies::PolicyMap::Get(
  cmPolicies::PolicyID id) const
{
  PolicyStatus status = cmPolicies::WARN;

  if (this->Status[(POLICY_STATUS_COUNT * id) + OLD]) {
    status = cmPolicies::OLD;
  } else if (this->Status[(POLICY_STATUS_COUNT * id) + NEW]) {
    status = cmPolicies::NEW;
  }
  return status;
}